

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_273a44::OSScapture::start(OSScapture *this)

{
  long *local_20;
  thread local_18;
  
  (this->mKillNow)._M_base._M_i = false;
  local_18._M_id._M_thread = (id)0;
  local_20 = (long *)::operator_new(0x20);
  *local_20 = (long)&PTR___State_001b1818;
  local_20[1] = (long)this;
  local_20[2] = (long)recordProc;
  local_20[3] = 0;
  std::thread::_M_start_thread(&local_18,&local_20,0);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  if ((this->mThread)._M_id._M_thread == 0) {
    (this->mThread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void OSScapture::start()
{
    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&OSScapture::recordProc), this};
    }
    catch(std::exception& e) {
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start recording thread: %s",
            e.what()};
    }
}